

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpus.c
# Opt level: O1

void resume_all_vcpus_mips(uc_struct_conflict4 *uc)

{
  CPUState *pCVar1;
  CPUState *pCVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  bool bVar6;
  
  pCVar1 = uc->cpu;
  pCVar1->halted = 0;
  pCVar1->exit_request = false;
  pCVar1->exception_index = -1;
  pCVar1->stopped = false;
  pCVar1->created = true;
  pCVar1->stop = false;
  bVar4 = false;
LAB_0071479b:
  do {
    bVar6 = bVar4;
    if (uc->exit_request == 0) {
      pCVar2 = uc->cpu;
      if ((pCVar2->stop == false) && (pCVar2->stopped == false)) {
        uc->quit_request = false;
        iVar5 = cpu_exec_mips(uc,pCVar2);
        if ((uc->quit_request == true) && (uc->stop_request == false)) {
          uc->stop_request = false;
          pCVar2->halted = 0;
          pCVar2->exit_request = false;
          pCVar2->exception_index = -1;
          pCVar2->stop = false;
          pCVar2->stopped = false;
        }
        else if (uc->stop_request != false) {
          bVar6 = true;
          goto LAB_007147e9;
        }
        if ((uc->invalid_error == 0) && (iVar5 != 0x10001)) {
          if (iVar5 == 0x10002) {
            pCVar2->stopped = true;
            goto LAB_007147e9;
          }
          bVar3 = true;
        }
        else {
          bVar3 = false;
          bVar6 = true;
        }
      }
      else {
LAB_007147e9:
        bVar3 = false;
      }
      bVar4 = bVar6;
      if (bVar3) goto LAB_0071479b;
    }
    uc->exit_request = 0;
    pCVar2 = uc->cpu;
    pCVar2->exit_request = false;
    (pCVar2->icount_decr_ptr->u16).high = 0;
    uc->cpu->tcg_exit_req = 0;
    bVar4 = false;
    if (bVar6) {
      if (uc->use_exits == 0) {
        if (uc->exits[(long)uc->nested_level + -1] != 0) {
          (*uc->uc_invalidate_tb)(uc,uc->exits[(long)uc->nested_level + -1] - 1,1);
        }
      }
      else {
        g_tree_foreach(uc->ctl_exits,uc_exit_invalidate_iter,uc);
      }
      pCVar1->created = false;
      return;
    }
  } while( true );
}

Assistant:

void resume_all_vcpus(struct uc_struct* uc)
{
    CPUState *cpu = uc->cpu;
    cpu->halted = 0;
    cpu->exit_request = 0;
    cpu->exception_index = -1;
    cpu_resume(cpu);
    /* static void qemu_tcg_cpu_loop(struct uc_struct *uc) */
    cpu->created = true;
    while (true) {
        if (tcg_cpu_exec(uc)) {
            break;
        }
    }

    // clear the cache of the exits address, since the generated code
    // at that address is to exit emulation, but not for the instruction there.
    // if we dont do this, next time we cannot emulate at that address
    if (uc->use_exits) {
        g_tree_foreach(uc->ctl_exits, uc_exit_invalidate_iter, (void*)uc);
    } else {
        uc_exit_invalidate_iter((gpointer)&uc->exits[uc->nested_level - 1], NULL, (gpointer)uc);
    }

    cpu->created = false;
}